

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O1

void __thiscall
t_java_generator::generate_deserialize_field
          (t_java_generator *this,ostream *out,t_field *tfield,string *prefix,bool has_metadata)

{
  uint uVar1;
  pointer pcVar2;
  int iVar3;
  t_struct *tstruct;
  ostream *poVar4;
  long *plVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  size_type *psVar7;
  long lVar8;
  char *pcVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  undefined1 auVar11 [12];
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  tstruct = (t_struct *)t_type::get_true_type(tfield->type_);
  iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[4])(tstruct);
  if ((char)iVar3 != '\0') {
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x20);
    std::operator+(&local_d0,"CANNOT GENERATE DESERIALIZE CODE FOR void TYPE: ",prefix);
    std::operator+(pbVar6,&local_d0,&tfield->name_);
    __cxa_throw(pbVar6,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  std::operator+(&local_d0,prefix,&tfield->name_);
  iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[0xb])(tstruct);
  if (((char)iVar3 == '\0') &&
     (iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[0xc])(tstruct), (char)iVar3 == '\0')
     ) {
    iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[0xd])(tstruct);
    if ((char)iVar3 != '\0') {
      paVar10 = &local_90.field_2;
      local_90._M_dataplus._M_p = (pointer)paVar10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,local_d0._M_dataplus._M_p,
                 local_d0._M_dataplus._M_p + local_d0._M_string_length);
      generate_deserialize_container(this,out,(t_type *)tstruct,&local_90,has_metadata);
      local_50._M_dataplus._M_p = local_90._M_dataplus._M_p;
      goto LAB_002516e6;
    }
    iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[5])(tstruct);
    if ((char)iVar3 != '\0') {
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_d0._M_dataplus._M_p,local_d0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," = iprot.",9);
      uVar1 = *(uint *)&(tstruct->members_).
                        super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                        super__Vector_impl_data._M_start;
      lVar8 = 0xb;
      switch(uVar1) {
      case 0:
        pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __cxa_allocate_exception(0x20);
        std::operator+(pbVar6,"compiler error: cannot serialize void field in a struct: ",&local_d0)
        ;
        __cxa_throw(pbVar6,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      case 1:
        iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[7])(tstruct);
        pcVar9 = "readString();";
        if ((char)iVar3 != '\0') {
          pcVar9 = "readBinary();";
        }
        lVar8 = 0xd;
        break;
      case 2:
        pcVar9 = "readBool();";
        break;
      case 3:
        pcVar9 = "readByte();";
        break;
      case 4:
        lVar8 = 10;
        pcVar9 = "readI16();";
        break;
      case 5:
        lVar8 = 10;
        pcVar9 = "readI32();";
        break;
      case 6:
        lVar8 = 10;
        pcVar9 = "readI64();";
        break;
      case 7:
        lVar8 = 0xd;
        pcVar9 = "readDouble();";
        break;
      default:
        auVar11 = __cxa_allocate_exception(0x20);
        t_base_type::t_base_name_abi_cxx11_(&local_b0,(t_base_type *)(ulong)uVar1,auVar11._8_4_);
        std::operator+(auVar11._0_8_,"compiler error: no Java name for base type ",&local_b0);
        __cxa_throw(auVar11._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      std::__ostream_insert<char,std::char_traits<char>>(out,pcVar9,lVar8);
      std::__ostream_insert<char,std::char_traits<char>>
                (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      goto LAB_002516f0;
    }
    iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[10])(tstruct);
    if ((char)iVar3 == '\0') {
      pcVar2 = (tfield->name_)._M_dataplus._M_p;
      type_name_abi_cxx11_(&local_b0,this,(t_type *)tstruct,false,false,false,false);
      printf("DO NOT KNOW HOW TO DESERIALIZE FIELD \'%s\' TYPE \'%s\'\n",pcVar2,
             local_b0._M_dataplus._M_p);
      local_50._M_dataplus._M_p = local_b0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p == &local_b0.field_2) goto LAB_002516f0;
    }
    else {
      poVar4 = t_generator::indent((t_generator *)this,out);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_d0._M_dataplus._M_p,local_d0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
      type_name_abi_cxx11_(&local_50,this,tfield->type_,true,false,false,true);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
      psVar7 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_b0.field_2._M_allocated_capacity = *psVar7;
        local_b0.field_2._8_8_ = plVar5[3];
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      }
      else {
        local_b0.field_2._M_allocated_capacity = *psVar7;
        local_b0._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_b0._M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_b0._M_dataplus._M_p,local_b0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_002516f0;
    }
  }
  else {
    paVar10 = &local_70.field_2;
    local_70._M_dataplus._M_p = (pointer)paVar10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,local_d0._M_dataplus._M_p,
               local_d0._M_dataplus._M_p + local_d0._M_string_length);
    generate_deserialize_struct(this,out,tstruct,&local_70);
    local_50._M_dataplus._M_p = local_70._M_dataplus._M_p;
LAB_002516e6:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == paVar10) goto LAB_002516f0;
  }
  operator_delete(local_50._M_dataplus._M_p);
LAB_002516f0:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_java_generator::generate_deserialize_field(ostream& out,
                                                  t_field* tfield,
                                                  string prefix,
                                                  bool has_metadata) {
  t_type* type = get_true_type(tfield->get_type());

  if (type->is_void()) {
    throw "CANNOT GENERATE DESERIALIZE CODE FOR void TYPE: " + prefix + tfield->get_name();
  }

  string name = prefix + tfield->get_name();

  if (type->is_struct() || type->is_xception()) {
    generate_deserialize_struct(out, (t_struct*)type, name);
  } else if (type->is_container()) {
    generate_deserialize_container(out, type, name, has_metadata);
  } else if (type->is_base_type()) {
    indent(out) << name << " = iprot.";

    t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
    switch (tbase) {
    case t_base_type::TYPE_VOID:
      throw "compiler error: cannot serialize void field in a struct: " + name;
      break;
    case t_base_type::TYPE_STRING:
      if (type->is_binary()) {
        out << "readBinary();";
      } else {
        out << "readString();";
      }
      break;
    case t_base_type::TYPE_BOOL:
      out << "readBool();";
      break;
    case t_base_type::TYPE_I8:
      out << "readByte();";
      break;
    case t_base_type::TYPE_I16:
      out << "readI16();";
      break;
    case t_base_type::TYPE_I32:
      out << "readI32();";
      break;
    case t_base_type::TYPE_I64:
      out << "readI64();";
      break;
    case t_base_type::TYPE_DOUBLE:
      out << "readDouble();";
      break;
    default:
      throw "compiler error: no Java name for base type " + t_base_type::t_base_name(tbase);
    }
    out << endl;
  } else if (type->is_enum()) {
    indent(out) << name << " = "
                << type_name(tfield->get_type(), true, false, false, true)
                   + ".findByValue(iprot.readI32());" << endl;
  } else {
    printf("DO NOT KNOW HOW TO DESERIALIZE FIELD '%s' TYPE '%s'\n",
           tfield->get_name().c_str(),
           type_name(type).c_str());
  }
}